

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayRef.h
# Opt level: O3

bool __thiscall llvm::sys::UnicodeCharSet::rangesAreValid(UnicodeCharSet *this)

{
  size_type sVar1;
  bool bVar2;
  raw_ostream *prVar3;
  long lVar4;
  UnicodeCharRange *pUVar5;
  uint uVar6;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  
  sVar1 = (this->Ranges).Length;
  if (sVar1 != 0) {
    pUVar5 = (this->Ranges).Data;
    lVar4 = 0;
    uVar6 = 0;
    do {
      if ((lVar4 != 0) && (pUVar5->Lower <= uVar6)) {
        if ((DebugFlag == '\x01') && (bVar2 = isCurrentDebugType("unicode"), bVar2)) {
          prVar3 = dbgs();
          Str.Length = 0xe;
          Str.Data = "Upper bound 0x";
          raw_ostream::operator<<(prVar3,Str);
        }
        if ((DebugFlag == '\x01') && (bVar2 = isCurrentDebugType("unicode"), bVar2)) {
          prVar3 = dbgs();
          raw_ostream::write_hex(prVar3,(ulong)uVar6);
        }
        if ((DebugFlag == '\x01') && (bVar2 = isCurrentDebugType("unicode"), bVar2)) {
          prVar3 = dbgs();
          Str_00.Length = 0x2e;
          Str_00.Data = " should be less than succeeding lower bound 0x";
          raw_ostream::operator<<(prVar3,Str_00);
        }
        if (DebugFlag != '\x01') {
          return false;
        }
        bVar2 = isCurrentDebugType("unicode");
        if (!bVar2) {
          return false;
        }
LAB_001d1344:
        prVar3 = dbgs();
        prVar3 = raw_ostream::write_hex(prVar3,(ulong)pUVar5->Lower);
        Str_03.Length = 1;
        Str_03.Data = "\n";
        raw_ostream::operator<<(prVar3,Str_03);
        return false;
      }
      uVar6 = pUVar5->Upper;
      if (uVar6 < pUVar5->Lower) {
        if ((DebugFlag == '\x01') && (bVar2 = isCurrentDebugType("unicode"), bVar2)) {
          prVar3 = dbgs();
          Str_01.Length = 0xe;
          Str_01.Data = "Upper bound 0x";
          raw_ostream::operator<<(prVar3,Str_01);
        }
        if ((DebugFlag == '\x01') && (bVar2 = isCurrentDebugType("unicode"), bVar2)) {
          prVar3 = dbgs();
          raw_ostream::write_hex(prVar3,(ulong)pUVar5->Lower);
        }
        if ((DebugFlag == '\x01') && (bVar2 = isCurrentDebugType("unicode"), bVar2)) {
          prVar3 = dbgs();
          Str_02.Length = 0x27;
          Str_02.Data = " should not be less than lower bound 0x";
          raw_ostream::operator<<(prVar3,Str_02);
        }
        if (DebugFlag != '\x01') {
          return false;
        }
        bVar2 = isCurrentDebugType("unicode");
        if (!bVar2) {
          return false;
        }
        pUVar5 = (UnicodeCharRange *)&pUVar5->Upper;
        goto LAB_001d1344;
      }
      pUVar5 = pUVar5 + 1;
      lVar4 = lVar4 + -8;
    } while (-lVar4 != sVar1 * 8);
  }
  return true;
}

Assistant:

iterator end() const { return Data + Length; }